

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O2

void ExpReplay::predict_or_learn<true,MULTICLASS::mc_label>
               (expreplay *er,single_learner *base,example *ec)

{
  polylabel *ppVar1;
  ulong uVar2;
  example *peVar3;
  label_t lVar4;
  wclass *pwVar5;
  size_t sVar6;
  bool *pbVar7;
  ulong uVar8;
  ulong uVar9;
  size_t n;
  float fVar10;
  
  LEARNER::learner<char,_example>::predict(base,ec,0);
  ppVar1 = &ec->l;
  fVar10 = (float)(*(code *)PTR_weight_002a6a68)(ppVar1);
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    uVar9 = 1;
    while( true ) {
      uVar2 = er->replay_count;
      fVar10 = merand48(&er->all->random_state);
      pbVar7 = er->filled;
      fVar10 = fVar10 * (float)er->N;
      uVar8 = (ulong)fVar10;
      uVar8 = (long)(fVar10 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
      if (uVar2 <= uVar9) break;
      if (pbVar7[uVar8] != false) {
        LEARNER::learner<char,_example>::learn(base,er->buf + uVar8,0);
      }
      uVar9 = uVar9 + 1;
    }
    if (pbVar7[uVar8] != false) {
      LEARNER::learner<char,_example>::learn(base,er->buf + uVar8,0);
      pbVar7 = er->filled;
    }
    pbVar7[uVar8] = true;
    VW::copy_example_data(er->all->audit,er->buf + uVar8,ec);
    peVar3 = er->buf;
    if (DAT_002a6a70 != (code *)0x0) {
      (*DAT_002a6a70)(&peVar3[uVar8].l,ppVar1);
      return;
    }
    peVar3[uVar8].l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
    lVar4 = ppVar1->multi;
    pwVar5 = (ec->l).cs.costs._end;
    sVar6 = (ec->l).cs.costs.erase_count;
    peVar3[uVar8].l.cs.costs.end_array = (ec->l).cs.costs.end_array;
    peVar3[uVar8].l.cs.costs.erase_count = sVar6;
    peVar3[uVar8].l.multi = lVar4;
    peVar3[uVar8].l.cs.costs._end = pwVar5;
  }
  return;
}

Assistant:

void predict_or_learn(expreplay& er, LEARNER::single_learner& base, example& ec)
{  // regardless of what happens, we must predict
  base.predict(ec);
  // if we're not learning, that's all that has to happen
  if (!is_learn || lp.get_weight(&ec.l) == 0.)
    return;

  for (size_t replay = 1; replay < er.replay_count; replay++)
  {
    size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
    if (er.filled[n])
      base.learn(er.buf[n]);
  }

  size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
  if (er.filled[n])
    base.learn(er.buf[n]);

  er.filled[n] = true;
  VW::copy_example_data(er.all->audit, &er.buf[n], &ec);  // don't copy the label
  if (lp.copy_label)
    lp.copy_label(&er.buf[n].l, &ec.l);
  else
    er.buf[n].l = ec.l;
}